

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O0

Result __thiscall wabt::ExprVisitor::HandleDefaultState(ExprVisitor *this,Expr *expr)

{
  Delegate *pDVar1;
  bool bVar2;
  ExprType EVar3;
  Result RVar4;
  BlockExprBase<(wabt::ExprType)7> *pBVar5;
  IfExpr *pIVar6;
  IfExceptExpr *pIVar7;
  BlockExprBase<(wabt::ExprType)22> *pBVar8;
  TryExpr *pTVar9;
  TryExpr *try_expr;
  BlockExprBase<(wabt::ExprType)22> *loop_expr;
  IfExceptExpr *if_except_expr;
  IfExpr *if_expr;
  BlockExprBase<(wabt::ExprType)7> *block_expr;
  Expr *expr_local;
  ExprVisitor *this_local;
  
  EVar3 = Expr::type(expr);
  switch(EVar3) {
  case AtomicLoad:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)0>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x34])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicRmw:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)1>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x36])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicRmwCmpxchg:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)2>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x37])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicStore:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)3>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x35])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicWait:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)4>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x32])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicWake:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)5>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x33])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Binary:
    pDVar1 = this->delegate_;
    cast<wabt::OpcodeExpr<(wabt::ExprType)6>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[2])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Block:
    pBVar5 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(expr);
    RVar4.enum_ = (*this->delegate_->_vptr_Delegate[3])(this->delegate_,pBVar5);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    PushExprlist(this,Block,expr,&(pBVar5->block).exprs);
    break;
  case Br:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[5])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case BrIf:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[6])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case BrTable:
    pDVar1 = this->delegate_;
    cast<wabt::BrTableExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[7])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Call:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)11>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[8])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case CallIndirect:
    pDVar1 = this->delegate_;
    cast<wabt::CallIndirectExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[9])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Compare:
    pDVar1 = this->delegate_;
    cast<wabt::OpcodeExpr<(wabt::ExprType)13>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[10])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Const:
    pDVar1 = this->delegate_;
    cast<wabt::ConstExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0xb])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Convert:
    pDVar1 = this->delegate_;
    cast<wabt::OpcodeExpr<(wabt::ExprType)15>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0xc])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Drop:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)16>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0xd])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case GetGlobal:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)17>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0xe])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case GetLocal:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0xf])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case If:
    pIVar6 = cast<wabt::IfExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*this->delegate_->_vptr_Delegate[0x10])(this->delegate_,pIVar6);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    PushExprlist(this,IfTrue,expr,&(pIVar6->true_).exprs);
    break;
  case IfExcept:
    pIVar7 = cast<wabt::IfExceptExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*this->delegate_->_vptr_Delegate[0x13])(this->delegate_,pIVar7);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    PushExprlist(this,IfExceptTrue,expr,&(pIVar7->true_).exprs);
    break;
  case Load:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)21>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x16])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Loop:
    pBVar8 = cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>(expr);
    RVar4.enum_ = (*this->delegate_->_vptr_Delegate[0x17])(this->delegate_,pBVar8);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    PushExprlist(this,Loop,expr,&(pBVar8->block).exprs);
    break;
  case MemoryCopy:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)23>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x19])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryDrop:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x1a])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryFill:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)25>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x1b])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryGrow:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)26>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x1c])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryInit:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)27>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x1d])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemorySize:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)28>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x1e])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Nop:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)29>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x22])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Rethrow:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)30>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x31])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Return:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)31>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x23])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case ReturnCall:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)32>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x24])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case ReturnCallIndirect:
    pDVar1 = this->delegate_;
    cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x25])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Select:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)34>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x26])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SetGlobal:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)35>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x27])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SetLocal:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x28])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SimdLaneOp:
    pDVar1 = this->delegate_;
    cast<wabt::SimdLaneOpExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x39])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case SimdShuffleOp:
    pDVar1 = this->delegate_;
    cast<wabt::SimdShuffleOpExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x3a])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Store:
    pDVar1 = this->delegate_;
    cast<wabt::LoadStoreExpr<(wabt::ExprType)39>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x29])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableInit:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)40>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x21])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableCopy:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)41>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x1f])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableDrop:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)42>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x20])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TeeLocal:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)43>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x2a])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Ternary:
    pDVar1 = this->delegate_;
    cast<wabt::OpcodeExpr<(wabt::ExprType)44>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x38])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Throw:
    pDVar1 = this->delegate_;
    cast<wabt::VarExpr<(wabt::ExprType)45>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x30])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Try:
    pTVar9 = cast<wabt::TryExpr,wabt::Expr>(expr);
    RVar4.enum_ = (*this->delegate_->_vptr_Delegate[0x2d])(this->delegate_,pTVar9);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    PushExprlist(this,Try,expr,&(pTVar9->block).exprs);
    break;
  case Unary:
    pDVar1 = this->delegate_;
    cast<wabt::OpcodeExpr<(wabt::ExprType)47>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x2b])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Last:
    pDVar1 = this->delegate_;
    cast<wabt::ExprMixin<(wabt::ExprType)48>,wabt::Expr>(expr);
    RVar4.enum_ = (*pDVar1->_vptr_Delegate[0x2c])();
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result ExprVisitor::HandleDefaultState(Expr* expr) {
  switch (expr->type()) {
    case ExprType::AtomicLoad:
      CHECK_RESULT(delegate_->OnAtomicLoadExpr(cast<AtomicLoadExpr>(expr)));
      break;

    case ExprType::AtomicStore:
      CHECK_RESULT(delegate_->OnAtomicStoreExpr(cast<AtomicStoreExpr>(expr)));
      break;

    case ExprType::AtomicRmw:
      CHECK_RESULT(delegate_->OnAtomicRmwExpr(cast<AtomicRmwExpr>(expr)));
      break;

    case ExprType::AtomicRmwCmpxchg:
      CHECK_RESULT(
          delegate_->OnAtomicRmwCmpxchgExpr(cast<AtomicRmwCmpxchgExpr>(expr)));
      break;

    case ExprType::AtomicWait:
      CHECK_RESULT(delegate_->OnAtomicWaitExpr(cast<AtomicWaitExpr>(expr)));
      break;

    case ExprType::AtomicWake:
      CHECK_RESULT(delegate_->OnAtomicWakeExpr(cast<AtomicWakeExpr>(expr)));
      break;

    case ExprType::Binary:
      CHECK_RESULT(delegate_->OnBinaryExpr(cast<BinaryExpr>(expr)));
      break;

    case ExprType::Block: {
      auto block_expr = cast<BlockExpr>(expr);
      CHECK_RESULT(delegate_->BeginBlockExpr(block_expr));
      PushExprlist(State::Block, expr, block_expr->block.exprs);
      break;
    }

    case ExprType::Br:
      CHECK_RESULT(delegate_->OnBrExpr(cast<BrExpr>(expr)));
      break;

    case ExprType::BrIf:
      CHECK_RESULT(delegate_->OnBrIfExpr(cast<BrIfExpr>(expr)));
      break;

    case ExprType::BrTable:
      CHECK_RESULT(delegate_->OnBrTableExpr(cast<BrTableExpr>(expr)));
      break;

    case ExprType::Call:
      CHECK_RESULT(delegate_->OnCallExpr(cast<CallExpr>(expr)));
      break;

    case ExprType::CallIndirect:
      CHECK_RESULT(delegate_->OnCallIndirectExpr(cast<CallIndirectExpr>(expr)));
      break;

    case ExprType::Compare:
      CHECK_RESULT(delegate_->OnCompareExpr(cast<CompareExpr>(expr)));
      break;

    case ExprType::Const:
      CHECK_RESULT(delegate_->OnConstExpr(cast<ConstExpr>(expr)));
      break;

    case ExprType::Convert:
      CHECK_RESULT(delegate_->OnConvertExpr(cast<ConvertExpr>(expr)));
      break;

    case ExprType::Drop:
      CHECK_RESULT(delegate_->OnDropExpr(cast<DropExpr>(expr)));
      break;

    case ExprType::GetGlobal:
      CHECK_RESULT(delegate_->OnGetGlobalExpr(cast<GetGlobalExpr>(expr)));
      break;

    case ExprType::GetLocal:
      CHECK_RESULT(delegate_->OnGetLocalExpr(cast<GetLocalExpr>(expr)));
      break;

    case ExprType::If: {
      auto if_expr = cast<IfExpr>(expr);
      CHECK_RESULT(delegate_->BeginIfExpr(if_expr));
      PushExprlist(State::IfTrue, expr, if_expr->true_.exprs);
      break;
    }

    case ExprType::IfExcept: {
      auto if_except_expr = cast<IfExceptExpr>(expr);
      CHECK_RESULT(delegate_->BeginIfExceptExpr(if_except_expr));
      PushExprlist(State::IfExceptTrue, expr, if_except_expr->true_.exprs);
      break;
    }

    case ExprType::Load:
      CHECK_RESULT(delegate_->OnLoadExpr(cast<LoadExpr>(expr)));
      break;

    case ExprType::Loop: {
      auto loop_expr = cast<LoopExpr>(expr);
      CHECK_RESULT(delegate_->BeginLoopExpr(loop_expr));
      PushExprlist(State::Loop, expr, loop_expr->block.exprs);
      break;
    }

    case ExprType::MemoryCopy:
      CHECK_RESULT(delegate_->OnMemoryCopyExpr(cast<MemoryCopyExpr>(expr)));
      break;

    case ExprType::MemoryDrop:
      CHECK_RESULT(delegate_->OnMemoryDropExpr(cast<MemoryDropExpr>(expr)));
      break;

    case ExprType::MemoryFill:
      CHECK_RESULT(delegate_->OnMemoryFillExpr(cast<MemoryFillExpr>(expr)));
      break;

    case ExprType::MemoryGrow:
      CHECK_RESULT(delegate_->OnMemoryGrowExpr(cast<MemoryGrowExpr>(expr)));
      break;

    case ExprType::MemoryInit:
      CHECK_RESULT(delegate_->OnMemoryInitExpr(cast<MemoryInitExpr>(expr)));
      break;

    case ExprType::MemorySize:
      CHECK_RESULT(delegate_->OnMemorySizeExpr(cast<MemorySizeExpr>(expr)));
      break;

    case ExprType::TableCopy:
      CHECK_RESULT(delegate_->OnTableCopyExpr(cast<TableCopyExpr>(expr)));
      break;

    case ExprType::TableDrop:
      CHECK_RESULT(delegate_->OnTableDropExpr(cast<TableDropExpr>(expr)));
      break;

    case ExprType::TableInit:
      CHECK_RESULT(delegate_->OnTableInitExpr(cast<TableInitExpr>(expr)));
      break;

    case ExprType::Nop:
      CHECK_RESULT(delegate_->OnNopExpr(cast<NopExpr>(expr)));
      break;

    case ExprType::Rethrow:
      CHECK_RESULT(delegate_->OnRethrowExpr(cast<RethrowExpr>(expr)));
      break;

    case ExprType::Return:
      CHECK_RESULT(delegate_->OnReturnExpr(cast<ReturnExpr>(expr)));
      break;

    case ExprType::ReturnCall:
      CHECK_RESULT(delegate_->OnReturnCallExpr(cast<ReturnCallExpr>(expr)));
      break;

    case ExprType::ReturnCallIndirect:
      CHECK_RESULT(delegate_->OnReturnCallIndirectExpr(
          cast<ReturnCallIndirectExpr>(expr)));
      break;

    case ExprType::Select:
      CHECK_RESULT(delegate_->OnSelectExpr(cast<SelectExpr>(expr)));
      break;

    case ExprType::SetGlobal:
      CHECK_RESULT(delegate_->OnSetGlobalExpr(cast<SetGlobalExpr>(expr)));
      break;

    case ExprType::SetLocal:
      CHECK_RESULT(delegate_->OnSetLocalExpr(cast<SetLocalExpr>(expr)));
      break;

    case ExprType::Store:
      CHECK_RESULT(delegate_->OnStoreExpr(cast<StoreExpr>(expr)));
      break;

    case ExprType::TeeLocal:
      CHECK_RESULT(delegate_->OnTeeLocalExpr(cast<TeeLocalExpr>(expr)));
      break;

    case ExprType::Throw:
      CHECK_RESULT(delegate_->OnThrowExpr(cast<ThrowExpr>(expr)));
      break;

    case ExprType::Try: {
      auto try_expr = cast<TryExpr>(expr);
      CHECK_RESULT(delegate_->BeginTryExpr(try_expr));
      PushExprlist(State::Try, expr, try_expr->block.exprs);
      break;
    }

    case ExprType::Unary:
      CHECK_RESULT(delegate_->OnUnaryExpr(cast<UnaryExpr>(expr)));
      break;

    case ExprType::Ternary:
      CHECK_RESULT(delegate_->OnTernaryExpr(cast<TernaryExpr>(expr)));
      break;

    case ExprType::SimdLaneOp: {
      CHECK_RESULT(delegate_->OnSimdLaneOpExpr(cast<SimdLaneOpExpr>(expr)));
      break;
    }

    case ExprType::SimdShuffleOp: {
      CHECK_RESULT(
          delegate_->OnSimdShuffleOpExpr(cast<SimdShuffleOpExpr>(expr)));
      break;
    }

    case ExprType::Unreachable:
      CHECK_RESULT(delegate_->OnUnreachableExpr(cast<UnreachableExpr>(expr)));
      break;
  }

  return Result::Ok;
}